

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O1

void anon_unknown.dwarf_17692f::compressUncompress(unsigned_short *raw,int n)

{
  int iVar1;
  char *pcVar2;
  ushort *puVar3;
  ulong uVar4;
  ostream *poVar5;
  
  pcVar2 = (char *)operator_new__((ulong)(n * 3 + 0x40000));
  puVar3 = (ushort *)operator_new__((ulong)(uint)n * 2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compressing ",0xc);
  std::ostream::flush();
  iVar1 = Imf_3_2::hufCompress(raw,n,pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"uncompressing ",0xe);
  std::ostream::flush();
  Imf_3_2::hufUncompress(pcVar2,iVar1,puVar3,n);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing: ",0xb);
  std::ostream::flush();
  if (0 < n) {
    uVar4 = 0;
    do {
      if (puVar3[uVar4] != raw[uVar4]) {
        __assert_fail("uncompressed[i] == raw[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testHuf.cpp"
                      ,99,
                      "void (anonymous namespace)::compressUncompress(const unsigned short *, int)")
        ;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes, compressed ",0x13);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  operator_delete__(puVar3);
  operator_delete__(pcVar2);
  return;
}

Assistant:

void
compressUncompress (const unsigned short raw[], int n)
{
    Array<char>           compressed (3 * n + 4 * 65536);
    Array<unsigned short> uncompressed (n);

    cout << "compressing " << flush;

    int nCompressed = hufCompress (raw, n, compressed);

    cout << "uncompressing " << flush;

    hufUncompress (compressed, nCompressed, uncompressed, n);

    cout << "comparing: " << flush;

    for (int i = 0; i < n; ++i)
        assert (uncompressed[i] == raw[i]);

    cout << sizeof (raw[0]) * n << " bytes, compressed " << nCompressed
         << " bytes" << endl;
}